

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O2

void uECC_decompress(uint8_t *compressed,uint8_t *public_key)

{
  uECC_word_t *result;
  uECC_word_t *result_00;
  uECC_word_t *result_01;
  uint uVar1;
  wordcount_t max_words;
  ulong uVar2;
  uint64_t local_b8;
  EccPoint point;
  uECC_word_t p1 [4];
  uECC_word_t l_result [4];
  
  vli_bytesToNative(&local_b8,compressed + 1);
  result_01 = point.x + 3;
  curve_x_side(result_01,&local_b8);
  result = point.y + 3;
  p1[1] = 0;
  p1[2] = 0;
  point.y[3] = 1;
  p1[0] = 0;
  result_00 = p1 + 3;
  p1[3] = 1;
  max_words = 0x11b570;
  vli_add(result,curve_p,result);
  uVar1 = vli_numBits(result,max_words);
  uVar2 = (ulong)uVar1;
  while (2 < (int)uVar2) {
    uVar1 = (int)uVar2 - 1;
    uVar2 = (ulong)uVar1;
    vli_modSquare_fast(result_00,result_00);
    if ((point.y[(ulong)(uVar1 >> 6) + 3] >> (uVar2 & 0x3f) & 1) != 0) {
      vli_modMult_fast(result_00,result_00,result_01);
    }
  }
  vli_set(result_01,p1 + 3);
  if (((uint)point.x[3] & 1) != (*compressed & 1)) {
    vli_sub(result_01,curve_p,result_01);
  }
  vli_nativeToBytes(public_key,&local_b8);
  vli_nativeToBytes(public_key + 0x20,result_01);
  return;
}

Assistant:

void uECC_decompress(const uint8_t compressed[uECC_BYTES+1], uint8_t public_key[uECC_BYTES*2]) {
    EccPoint point;
    vli_bytesToNative(point.x, compressed + 1);
    curve_x_side(point.y, point.x);
    mod_sqrt(point.y);

    if ((point.y[0] & 0x01) != (compressed[0] & 0x01)) {
        vli_sub(point.y, curve_p, point.y);
    }

    vli_nativeToBytes(public_key, point.x);
    vli_nativeToBytes(public_key + uECC_BYTES, point.y);
}